

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlStrstr(xmlChar *str,xmlChar *val)

{
  byte *pbVar1;
  bool bVar2;
  size_t sVar3;
  xmlChar xVar4;
  long lVar5;
  xmlChar *pxVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (val != (xmlChar *)0x0 && str != (xmlChar *)0x0) {
    pxVar6 = val;
    sVar3 = strlen((char *)val);
    if ((int)sVar3 == 0 || 0x7fffffff < sVar3) {
      return str;
    }
    xVar4 = *str;
    if (xVar4 != '\0') {
      do {
        if (xVar4 == *val) {
          if ((int)sVar3 < 1) {
            return str;
          }
          if (str == val) {
            return str;
          }
          lVar5 = 0;
          uVar8 = sVar3 & 0xffffffff;
          do {
            pbVar1 = val + lVar5;
            bVar2 = false;
            uVar9 = (uint)str[lVar5] - (uint)*pbVar1;
            if (uVar9 == 0) {
              uVar7 = (int)uVar8 - 1;
              uVar8 = (ulong)uVar7;
              if (uVar7 == 0) {
                uVar8 = 0;
                goto LAB_001d1a12;
              }
              bVar2 = true;
            }
            else {
LAB_001d1a12:
              pxVar6 = (xmlChar *)(ulong)uVar9;
            }
            if (!bVar2) goto LAB_001d1a33;
            lVar5 = lVar5 + 1;
          } while (*pbVar1 != 0);
          pxVar6 = (xmlChar *)0x0;
LAB_001d1a33:
          if ((int)pxVar6 == 0) {
            return str;
          }
        }
        xVar4 = str[1];
        str = str + 1;
      } while (xVar4 != '\0');
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlStrstr(const xmlChar *str, const xmlChar *val) {
    int n;

    if (str == NULL) return(NULL);
    if (val == NULL) return(NULL);
    n = xmlStrlen(val);

    if (n == 0) return(str);
    while (*str != 0) { /* non input consuming */
        if (*str == *val) {
            if (!xmlStrncmp(str, val, n)) return((const xmlChar *) str);
        }
        str++;
    }
    return(NULL);
}